

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetNoInitSetup(void *kinmem,int noInitSetup)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x135,"KINSetNoInitSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *(int *)((long)kinmem + 0xc0) = noInitSetup;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetNoInitSetup(void* kinmem, sunbooleantype noInitSetup)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem                  = (KINMem)kinmem;
  kin_mem->kin_noInitSetup = noInitSetup;

  return (KIN_SUCCESS);
}